

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

int __thiscall
icu_63::RelativeDateFormat::clone
          (RelativeDateFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RelativeDateFormat *this_00;
  undefined8 local_30;
  RelativeDateFormat *this_local;
  
  this_00 = (RelativeDateFormat *)UMemory::operator_new((UMemory *)0x2f8,(size_t)__fn);
  local_30 = (RelativeDateFormat *)0x0;
  if (this_00 != (RelativeDateFormat *)0x0) {
    RelativeDateFormat(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Format* RelativeDateFormat::clone(void) const {
    return new RelativeDateFormat(*this);
}